

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCallbacks.cpp
# Opt level: O2

void helicsFederateSetLoggingCallback
               (HelicsFederate fed,_func_void_int_char_ptr_char_ptr_void_ptr *logger,void *userdata,
               HelicsError *err)

{
  Federate *this;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  this = getFed(fed,err);
  if (this != (Federate *)0x0) {
    if (logger == (_func_void_int_char_ptr_char_ptr_void_ptr *)0x0) {
      local_28 = (code *)0x0;
      pcStack_20 = (code *)0x0;
      local_38._M_unused._M_object = (_func_void_int_char_ptr_char_ptr_void_ptr *)0x0;
      local_38._8_8_ = (void *)0x0;
      helics::Federate::setLoggingCallback
                (this,(function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)&local_38);
    }
    else {
      pcStack_20 = std::
                   _Function_handler<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/shared_api_library/helicsCallbacks.cpp:86:40)>
                   ::_M_invoke;
      local_28 = std::
                 _Function_handler<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/shared_api_library/helicsCallbacks.cpp:86:40)>
                 ::_M_manager;
      local_38._M_unused._0_8_ = (undefined8)logger;
      local_38._8_8_ = userdata;
      helics::Federate::setLoggingCallback
                (this,(function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)&local_38);
    }
    std::_Function_base::~_Function_base((_Function_base *)&local_38);
  }
  return;
}

Assistant:

void helicsFederateSetLoggingCallback(HelicsFederate fed,
                                      void (*logger)(int loglevel, const char* identifier, const char* message, void* userdata),
                                      void* userdata,
                                      HelicsError* err)
{
    auto* fedptr = getFed(fed, err);
    if (fedptr == nullptr) {
        return;
    }

    try {
        if (logger == nullptr) {
            fedptr->setLoggingCallback({});
        } else {
            fedptr->setLoggingCallback([logger, userdata](int loglevel, std::string_view ident, std::string_view message) {
                const std::string identifier(ident);
                const std::string mess(message);
                logger(loglevel, identifier.c_str(), mess.c_str(), userdata);
            });
        }
    }
    catch (...) {  // LCOV_EXCL_LINE
        helicsErrorHandler(err);  // LCOV_EXCL_LINE
    }
}